

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

bool __thiscall
DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
::HasNode(DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
          *this,NodeBase *node)

{
  bool bVar1;
  DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
  **ppDVar2;
  DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
  *local_28;
  NodeBase *current;
  NodeBase *node_local;
  DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
  *this_local;
  
  local_28 = DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
             ::Next(&this->
                     super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
                   );
  while( true ) {
    bVar1 = IsHead(this,local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    if (node == local_28) break;
    ppDVar2 = DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
              ::Next(local_28);
    local_28 = *ppDVar2;
  }
  return true;
}

Assistant:

bool HasNode(NodeBase * node) const
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            if (node == current)
            {
                return true;
            }
            current = current->Next();
        }
        return false;
    }